

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpeedTest.cpp
# Opt level: O0

int64_t timehash_small(pfHash hash,void *key,int len,int seed)

{
  ulong uVar1;
  uint *__dest;
  int in_ECX;
  int in_EDX;
  void *in_RSI;
  code *in_RDI;
  undefined1 auVar2 [16];
  undefined1 in_ZMM0 [64];
  undefined1 extraout_var [56];
  int i;
  uint32_t *buf;
  uint32_t hash_temp [16];
  unsigned_long_long end;
  unsigned_long_long begin;
  int NUM_TRIALS;
  int local_84;
  uint local_78 [18];
  uint64_t local_30;
  uint64_t local_28;
  undefined4 local_1c;
  int local_18;
  int local_14;
  void *local_10;
  code *local_8;
  
  local_1c = 200;
  local_18 = in_ECX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  memset(local_78,0,0x40);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)((local_14 + 3) / 4);
  uVar1 = SUB168(auVar2 * ZEXT816(4),0);
  if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
    uVar1 = 0xffffffffffffffff;
  }
  __dest = (uint *)operator_new__(uVar1);
  memcpy(__dest,local_10,(long)local_14);
  local_28 = timer_start();
  for (local_84 = 0; auVar2 = in_ZMM0._0_16_, local_84 < 200; local_84 = local_84 + 1) {
    in_ZMM0._0_8_ = (*local_8)(__dest,local_14,local_18,local_78);
    in_ZMM0._8_56_ = extraout_var;
    local_18 = local_78[0] + local_18;
    *__dest = local_78[0] ^ *__dest;
  }
  local_30 = timer_end();
  if (__dest != (uint *)0x0) {
    operator_delete__(__dest);
  }
  auVar2 = vcvtusi2sd_avx512f(auVar2,local_30 - local_28);
  return (long)(auVar2._0_8_ / 200.0);
}

Assistant:

NEVER_INLINE int64_t timehash_small ( pfHash hash, const void * key, int len, int seed )
{
  const int NUM_TRIALS = 200;
  volatile unsigned long long int begin, end;
  uint32_t hash_temp[16] = {};
  uint32_t *buf = new uint32_t[(len + 3) / 4];
  memcpy(buf,key,len);

  begin = timer_start();

  for(int i = 0; i < NUM_TRIALS; i++) {
    hash(buf,len,seed,hash_temp);
    // XXX Add dependency between invocations of hash-function to prevent parallel
    // evaluation of them. However this way the invocations still would not be
    // fully serialized. Another option is to use lfence instruction (load-from-memory
    // serialization instruction) or mfence (load-from-memory AND store-to-memory
    // serialization instruction):
    //   __asm volatile ("lfence");
    // It's hard to say which one is the most realistic and sensible approach.
    seed += hash_temp[0];
    buf[0] ^= hash_temp[0];
  }

  end = timer_end();
  delete[] buf;

  return (int64_t)((end - begin) / (double)NUM_TRIALS);
}